

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_weight_vector(T1_Face face,T1_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  undefined8 *puVar3;
  FT_Error FVar4;
  FT_Fixed FVar5;
  long lVar6;
  PS_Blend pPVar7;
  FT_Int num_designs;
  T1_TokenRec design_tokens [16];
  undefined8 uStack_1c8;
  FT_UInt local_1bc;
  T1_TokenRec_ local_1b8 [16];
  
  pPVar7 = face->blend;
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,local_1b8,0x10,(FT_Int *)&local_1bc);
  if ((int)local_1bc < 0) {
    FVar4 = 0xa2;
  }
  else {
    FVar4 = 3;
    if ((int)local_1bc < 0x11 && local_1bc != 0) {
      if ((pPVar7 == (PS_Blend)0x0) || (pPVar7->num_designs == 0)) {
        FVar4 = t1_allocate_blend(face,local_1bc,0);
        if (FVar4 != 0) goto LAB_0017a979;
        pPVar7 = face->blend;
      }
      else if (pPVar7->num_designs != local_1bc) goto LAB_0017a979;
      pFVar1 = (loader->parser).root.cursor;
      pFVar2 = (loader->parser).root.limit;
      if (0 < (int)local_1bc) {
        lVar6 = 0;
        puVar3 = &uStack_1c8;
        do {
          (loader->parser).root.cursor = (FT_Byte *)puVar3[2];
          (loader->parser).root.limit = (FT_Byte *)puVar3[3];
          FVar5 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
          pPVar7->weight_vector[lVar6] = FVar5;
          pPVar7->default_weight_vector[lVar6] = FVar5;
          lVar6 = lVar6 + 1;
          puVar3 = puVar3 + 3;
        } while (lVar6 < (int)local_1bc);
      }
      (loader->parser).root.cursor = pFVar1;
      (loader->parser).root.limit = pFVar2;
      FVar4 = 0;
    }
  }
LAB_0017a979:
  (loader->parser).root.error = FVar4;
  return;
}

Assistant:

static void
  parse_weight_vector( T1_Face    face,
                       T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Error     error  = FT_Err_Ok;
    T1_Parser    parser = &loader->parser;
    PS_Blend     blend  = face->blend;
    T1_Token     token;
    FT_Int       n;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;


    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !blend || !blend->num_designs )
    {
      error = t1_allocate_blend( face, (FT_UInt)num_designs, 0 );
      if ( error )
        goto Exit;
      blend = face->blend;
    }
    else if ( blend->num_designs != (FT_UInt)num_designs )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " /BlendDesignPosition and /WeightVector have\n"
                 "                    "
                 " different number of elements\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    old_cursor = parser->root.cursor;
    old_limit  = parser->root.limit;

    for ( n = 0; n < num_designs; n++ )
    {
      token = design_tokens + n;
      parser->root.cursor = token->start;
      parser->root.limit  = token->limit;

      blend->default_weight_vector[n] =
      blend->weight_vector[n]         = T1_ToFixed( parser, 0 );
    }

    parser->root.cursor = old_cursor;
    parser->root.limit  = old_limit;

  Exit:
    parser->root.error = error;
  }